

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

void __thiscall cmDependsFortran::cmDependsFortran(cmDependsFortran *this,cmLocalGenerator *lg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  pointer pbVar4;
  cmDependsFortranInternals *pcVar5;
  char *__s;
  size_t sVar6;
  long lVar7;
  _Rb_tree_header *p_Var8;
  pointer pbVar9;
  string def;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  definitions;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  cmDependsFortran *local_80;
  cmMakefile *local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  cmDepends::cmDepends(&this->super_cmDepends,lg,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsFortran_0062a0f8;
  local_c0 = &(this->SourceFile).field_2;
  (this->SourceFile)._M_dataplus._M_p = (pointer)local_c0;
  (this->SourceFile)._M_string_length = 0;
  (this->SourceFile).field_2._M_local_buf[0] = '\0';
  local_a8 = (string *)&this->CompilerId;
  local_c8 = &(this->CompilerId).field_2;
  (this->CompilerId)._M_dataplus._M_p = (pointer)local_c8;
  (this->CompilerId)._M_string_length = 0;
  (this->CompilerId).field_2._M_local_buf[0] = '\0';
  local_b0 = (string *)&this->SModSep;
  local_d0 = &(this->SModSep).field_2;
  (this->SModSep)._M_dataplus._M_p = (pointer)local_d0;
  (this->SModSep)._M_string_length = 0;
  (this->SModSep).field_2._M_local_buf[0] = '\0';
  local_b8 = (string *)&this->SModExt;
  local_d8 = &(this->SModExt).field_2;
  (this->SModExt)._M_dataplus._M_p = (pointer)local_d8;
  (this->SModExt)._M_string_length = 0;
  (this->SModExt).field_2._M_local_buf[0] = '\0';
  local_a0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->PPDefinitions;
  p_Var8 = &(this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = this;
  pcVar5 = (cmDependsFortranInternals *)operator_new(0x90);
  p_Var8 = &(pcVar5->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
  (pcVar5->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pcVar5->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pcVar5->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header
  ;
  (pcVar5->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var8->_M_header;
  (pcVar5->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = &(pcVar5->TargetRequires)._M_t._M_impl.super__Rb_tree_header;
  (pcVar5->TargetRequires)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pcVar5->TargetRequires)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pcVar5->TargetRequires)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header
  ;
  (pcVar5->TargetRequires)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var8->_M_header;
  (pcVar5->TargetRequires)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = &(pcVar5->ObjectInfo)._M_t._M_impl.super__Rb_tree_header;
  (pcVar5->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pcVar5->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pcVar5->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
  (pcVar5->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
  (pcVar5->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Internal = pcVar5;
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Fortran","");
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = ((this->super_cmDepends).LocalGenerator)->Makefile;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"CMAKE_TARGET_DEFINITIONS_Fortran","");
  __s = cmMakefile::GetDefinition(pcVar2,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_78 = pcVar2;
  if (__s != (char *)0x0) {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,__s,__s + sVar6);
    cmSystemTools::ExpandListArgument(&local_f8,&local_98,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar4 = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar9 = local_98.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar3 = (pbVar9->_M_dataplus)._M_p;
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar3,pcVar3 + pbVar9->_M_string_length);
      lVar7 = std::__cxx11::string::find((char)&local_f8,0x3d);
      if (lVar7 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_f8);
        std::__cxx11::string::operator=((string *)&local_f8,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>(local_a0,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar4);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"CMAKE_Fortran_COMPILER_ID","");
  pcVar2 = local_78;
  cmMakefile::GetSafeDefinition(local_78,&local_f8);
  std::__cxx11::string::_M_assign(local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"CMAKE_Fortran_SUBMODULE_SEP","");
  cmMakefile::GetSafeDefinition(pcVar2,&local_f8);
  std::__cxx11::string::_M_assign(local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"CMAKE_Fortran_SUBMODULE_EXT","");
  cmMakefile::GetSafeDefinition(pcVar2,&local_f8);
  std::__cxx11::string::_M_assign(local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

cmDependsFortran::cmDependsFortran(cmLocalGenerator* lg)
  : cmDepends(lg)
  , Internal(new cmDependsFortranInternals)
{
  // Configure the include file search path.
  this->SetIncludePathFromLanguage("Fortran");

  // Get the list of definitions.
  std::vector<std::string> definitions;
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  if (const char* c_defines =
        mf->GetDefinition("CMAKE_TARGET_DEFINITIONS_Fortran")) {
    cmSystemTools::ExpandListArgument(c_defines, definitions);
  }

  // translate i.e. FOO=BAR to FOO and add it to the list of defined
  // preprocessor symbols
  for (std::string def : definitions) {
    std::string::size_type assignment = def.find('=');
    if (assignment != std::string::npos) {
      def = def.substr(0, assignment);
    }
    this->PPDefinitions.insert(def);
  }

  this->CompilerId = mf->GetSafeDefinition("CMAKE_Fortran_COMPILER_ID");
  this->SModSep = mf->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
  this->SModExt = mf->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
}